

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O0

bool __thiscall
Clasp::Asp::LogicProgram::pushHead
          (LogicProgram *this,Head_t ht,AtomSpan *head,weight_t slack,RuleBuilder *out)

{
  bool bVar1;
  uint uVar2;
  Lit_t LVar3;
  WeightLit_t *pWVar4;
  Atom_t *pAVar5;
  int in_ECX;
  Span<unsigned_int> *in_RDX;
  E in_ESI;
  long in_RDI;
  Atom_t *end_1;
  Atom_t *it_1;
  weight_t wn;
  weight_t wp;
  iterator end;
  iterator it;
  bool sum;
  bool sat;
  uint32 hs;
  uint8 ignoreMask;
  undefined4 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  WeightLit_t *in_stack_ffffffffffffff50;
  WeightLit_t *in_stack_ffffffffffffff58;
  Atom_t v;
  WeightLit_t *in_stack_ffffffffffffff60;
  WeightLit_t *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  Head_t ht_00;
  IsLit __pred;
  Atom_t *local_70;
  IsLit local_68;
  IsLit local_64;
  uint32 local_60;
  uint local_5c;
  uint32 local_58;
  uint local_54;
  Id_t *local_50;
  Id_t *local_48;
  E local_3c;
  Body_t local_38;
  byte local_32;
  byte local_31;
  uint local_30;
  undefined1 local_29;
  int local_1c;
  Span<unsigned_int> *local_18;
  Head_t local_4;
  
  ht_00.val_ = (E)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_29 = 0x44;
  local_30 = 0;
  local_31 = 0;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_4.val_ = in_ESI;
  local_38 = Potassco::RuleBuilder::bodyType
                       ((RuleBuilder *)
                        CONCAT17(in_stack_ffffffffffffff4f,
                                 CONCAT16(in_stack_ffffffffffffff4e,
                                          CONCAT24(in_stack_ffffffffffffff4c,
                                                   in_stack_ffffffffffffff48))));
  uVar2 = Potassco::Body_t::operator_cast_to_unsigned_int(&local_38);
  local_32 = uVar2 == 1;
  local_3c = local_4.val_;
  Potassco::RuleBuilder::start((RuleBuilder *)in_stack_ffffffffffffff68,ht_00);
  local_48 = Potassco::begin<unsigned_int>(local_18);
  local_50 = Potassco::end<unsigned_int>((Span<unsigned_int> *)0x182b60);
  for (; local_48 != local_50; local_48 = local_48 + 1) {
    bVar1 = AtomState::isSet((AtomState *)in_stack_ffffffffffffff60,
                             (Var)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                             (uint8)((ulong)in_stack_ffffffffffffff58 >> 0x18));
    v = (Atom_t)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    if (bVar1) {
      bVar1 = AtomState::isSet((AtomState *)in_stack_ffffffffffffff60,v,
                               (uint8)((ulong)in_stack_ffffffffffffff58 >> 0x18));
      if (!bVar1) {
        __pred.lhs = (Lit_t)((ulong)(in_RDI + 0x98) >> 0x20);
        local_58 = (uint32)posLit(0x182c19);
        bVar1 = AtomState::inBody((AtomState *)in_stack_ffffffffffffff58,
                                  (Literal)(uint32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        local_54 = (uint)bVar1;
        local_60 = (uint32)negLit(0x182c53);
        bVar1 = AtomState::inBody((AtomState *)in_stack_ffffffffffffff58,
                                  (Literal)(uint32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        local_5c = (uint)bVar1;
        if ((local_54 != 0) && ((local_32 & 1) != 0)) {
          in_stack_ffffffffffffff60 =
               Potassco::RuleBuilder::wlits_begin((RuleBuilder *)in_stack_ffffffffffffff50);
          in_stack_ffffffffffffff68 =
               Potassco::RuleBuilder::wlits_end((RuleBuilder *)in_stack_ffffffffffffff50);
          LVar3 = Potassco::lit(*local_48);
          IsLit::IsLit(&local_64,LVar3);
          pWVar4 = std::find_if<Potassco::WeightLit_t*,Clasp::Asp::IsLit>
                             (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,__pred);
          local_54 = pWVar4->weight;
        }
        if ((local_5c != 0) && ((local_32 & 1) != 0)) {
          in_stack_ffffffffffffff50 =
               Potassco::RuleBuilder::wlits_begin((RuleBuilder *)in_stack_ffffffffffffff50);
          in_stack_ffffffffffffff58 =
               Potassco::RuleBuilder::wlits_end((RuleBuilder *)in_stack_ffffffffffffff50);
          LVar3 = Potassco::neg(0);
          IsLit::IsLit(&local_68,LVar3);
          pWVar4 = std::find_if<Potassco::WeightLit_t*,Clasp::Asp::IsLit>
                             (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,__pred);
          local_5c = pWVar4->weight;
        }
        bVar1 = AtomState::isFact((AtomState *)in_stack_ffffffffffffff50,
                                  CONCAT13(in_stack_ffffffffffffff4f,
                                           CONCAT12(in_stack_ffffffffffffff4e,
                                                    in_stack_ffffffffffffff4c)));
        if ((bVar1) || (local_1c < (int)local_54)) {
          local_31 = 1;
        }
        else if ((int)local_5c <= local_1c) {
          Potassco::RuleBuilder::addHead
                    ((RuleBuilder *)in_stack_ffffffffffffff60,
                     (Atom_t)((ulong)in_stack_ffffffffffffff58 >> 0x20));
          AtomState::addToHead
                    ((AtomState *)in_stack_ffffffffffffff50,
                     CONCAT13(in_stack_ffffffffffffff4f,
                              CONCAT12(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c)));
          local_30 = local_30 + 1;
        }
      }
    }
    else {
      Potassco::RuleBuilder::addHead((RuleBuilder *)in_stack_ffffffffffffff60,v);
      AtomState::addToHead
                ((AtomState *)in_stack_ffffffffffffff50,
                 CONCAT13(in_stack_ffffffffffffff4f,
                          CONCAT12(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c)));
      local_30 = local_30 + 1;
    }
  }
  local_70 = Potassco::RuleBuilder::head_begin((RuleBuilder *)in_stack_ffffffffffffff50);
  pAVar5 = local_70 + local_30;
  for (; local_70 != pAVar5; local_70 = local_70 + 1) {
    AtomState::clearRule
              ((AtomState *)in_stack_ffffffffffffff50,
               CONCAT13(in_stack_ffffffffffffff4f,
                        CONCAT12(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c)));
  }
  bVar1 = true;
  if ((local_31 & 1) != 0) {
    uVar2 = Potassco::Head_t::operator_cast_to_unsigned_int(&local_4);
    bVar1 = uVar2 == 1 && local_30 != 0;
  }
  return bVar1;
}

Assistant:

bool LogicProgram::pushHead(Head_t ht, const Potassco::AtomSpan& head, weight_t slack, RuleBuilder& out) {
	const uint8 ignoreMask = AtomState::false_flag|AtomState::head_flag;
	uint32 hs = 0;
	bool sat = false, sum = out.bodyType() == Body_t::Sum;
	out.start(ht);
	for (Potassco::AtomSpan::iterator it = Potassco::begin(head), end = Potassco::end(head); it != end; ++it) {
		if (!atomState_.isSet(*it, AtomState::simp_mask)) {
			out.addHead(*it);
			atomState_.addToHead(*it);
			++hs;
		}
		else if (!atomState_.isSet(*it, ignoreMask)) { // h occurs in B+ and/or B- or is true
			weight_t wp = weight_t(atomState_.inBody(posLit(*it))), wn = weight_t(atomState_.inBody(negLit(*it)));
			if (wp && sum) { wp = std::find_if(out.wlits_begin(), out.wlits_end(), IsLit(Potassco::lit(*it)))->weight; }
			if (wn && sum) { wn = std::find_if(out.wlits_begin(), out.wlits_end(), IsLit(Potassco::neg(*it)))->weight; }
			if (atomState_.isFact(*it) || wp > slack) { sat = true; }
			else if (wn <= slack) {
				out.addHead(*it);
				atomState_.addToHead(*it);
				++hs;
			}
		}
	}
	for (const Atom_t* it = out.head_begin(), *end = it + hs; it != end; ++it) {
		atomState_.clearRule(*it);
	}
	return !sat || (ht == Head_t::Choice && hs);
}